

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O2

vector<Config::Size,_std::allocator<Config::Size>_> *
ProgramOptions::parseTextureSize
          (vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,string *s)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  undefined8 *puVar4;
  pointer s_00;
  allocator local_89;
  vector<Config::Size,std::allocator<Config::Size>> *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  Size size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&size,",",(allocator *)&ss);
  string_split(&local_48,s,(string *)&size,false);
  std::__cxx11::string::~string((string *)&size);
  s_00 = local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (s_00 == local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if (*(pointer *)local_88 != *(pointer *)(local_88 + 8)) {
        return (vector<Config::Size,_std::allocator<Config::Size>_> *)local_88;
      }
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::__cxx11::string::operator=;
      __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::string((string *)&size,"x",&local_89);
    string_split(&ss,(string *)s_00,(string *)&size,false);
    std::__cxx11::string::~string((string *)&size);
    if ((long)ss.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)ss.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) break;
    if (parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,"^[1-9]\\d{0,9}$",
                   0x10);
        __cxa_atexit(Catch::clara::std::__cxx11::
                     basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                     &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_);
      }
    }
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (ss.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
    if (!bVar1) break;
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (ss.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
    if (!bVar1) break;
    size.w = 0;
    size.h = 0;
    uVar3 = std::__cxx11::stoul((string *)
                                ss.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
    size.w = (uint32_t)uVar3;
    uVar3 = std::__cxx11::stoul((string *)
                                (ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1),(size_t *)0x0,10);
    size.h = (uint)uVar3;
    if ((0x10000 < (uint)uVar3) || (0x10000 < size.w)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::__cxx11::string::operator=;
      __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
    }
    std::vector<Config::Size,std::allocator<Config::Size>>::emplace_back<Config::Size&>
              (local_88,&size);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ss);
    s_00 = (pointer)((string *)s_00 + 1);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::__cxx11::string::operator=;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

std::vector<Config::Size> ProgramOptions::parseTextureSize(const std::string& s)
{
    std::vector<Config::Size> result;

    try
    {
        for (const auto& p: string_split(s, ",", false))
        {
            auto ss = string_split(p, "x", false);
            if (ss.size() != 2)
                throw std::exception();

            static const std::regex e(R"(^[1-9]\d{0,9}$)");     // only integers > 0, no more than 10 digits (enough for 4294967295 - max uint32_t)
            if (!std::regex_match(ss[0], e))
                throw std::exception();
            if (!std::regex_match(ss[1], e))
                throw std::exception();

            Config::Size size;
            size.w = std::stoul(ss[0]);
            size.h = std::stoul(ss[1]);
            if (size.w  > 65536 || size.h > 65536)
                throw std::exception();
            result.emplace_back(size);
        }

        if (result.empty())
            throw std::exception();
    }
    catch (const std::exception&)
    {
        throw std::runtime_error("invalid texture size argument");
    }

    return result;
}